

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leb128.cc
# Opt level: O2

size_t wabt::ReadU64Leb128(uint8_t *p,uint8_t *end,uint64_t *out_value)

{
  byte bVar1;
  long lVar2;
  ulong uVar3;
  size_t sStack_8;
  
  if ((p < end) && (uVar3 = (ulong)(char)*p, -1 < (long)uVar3)) {
    sStack_8 = 1;
  }
  else if ((p + 1 < end) && (lVar2 = (long)(char)p[1], -1 < lVar2)) {
    uVar3 = (ulong)(*p & 0x7f) | lVar2 << 7;
    sStack_8 = 2;
  }
  else if ((p + 2 < end) && (lVar2 = (long)(char)p[2], -1 < lVar2)) {
    uVar3 = (ulong)(*p & 0x7f | (p[1] & 0x7f) << 7) | lVar2 << 0xe;
    sStack_8 = 3;
  }
  else if ((p + 3 < end) && (lVar2 = (long)(char)p[3], -1 < lVar2)) {
    uVar3 = (ulong)(*p & 0x7f | (p[1] & 0x7f) << 7 | (p[2] & 0x7f) << 0xe) | lVar2 << 0x15;
    sStack_8 = 4;
  }
  else if ((p + 4 < end) && (lVar2 = (long)(char)p[4], -1 < lVar2)) {
    uVar3 = (ulong)(*p & 0x7f | (p[1] & 0x7f) << 7 | (p[2] & 0x7f) << 0xe | (p[3] & 0x7f) << 0x15) |
            lVar2 << 0x1c;
    sStack_8 = 5;
  }
  else if ((p + 5 < end) && (lVar2 = (long)(char)p[5], -1 < lVar2)) {
    uVar3 = (ulong)(*p & 0x7f | (p[1] & 0x7f) << 7 | (p[2] & 0x7f) << 0xe | (p[3] & 0x7f) << 0x15) |
            (ulong)(p[4] & 0x7f) << 0x1c | lVar2 << 0x23;
    sStack_8 = 6;
  }
  else if ((p + 6 < end) && (lVar2 = (long)(char)p[6], -1 < lVar2)) {
    uVar3 = (ulong)(*p & 0x7f | (p[1] & 0x7f) << 7 | (p[2] & 0x7f) << 0xe | (p[3] & 0x7f) << 0x15) |
            (ulong)(p[4] & 0x7f) << 0x1c | (ulong)(p[5] & 0x7f) << 0x23 | lVar2 << 0x2a;
    sStack_8 = 7;
  }
  else if ((p + 7 < end) && (lVar2 = (long)(char)p[7], -1 < lVar2)) {
    uVar3 = (ulong)(*p & 0x7f | (p[1] & 0x7f) << 7 | (p[2] & 0x7f) << 0xe | (p[3] & 0x7f) << 0x15) |
            (ulong)(p[4] & 0x7f) << 0x1c | (ulong)(p[5] & 0x7f) << 0x23 |
            (ulong)(p[6] & 0x7f) << 0x2a | lVar2 << 0x31;
    sStack_8 = 8;
  }
  else if ((p + 8 < end) && (lVar2 = (long)(char)p[8], -1 < lVar2)) {
    uVar3 = (ulong)(*p & 0x7f | (p[1] & 0x7f) << 7 | (p[2] & 0x7f) << 0xe | (p[3] & 0x7f) << 0x15) |
            (ulong)(p[4] & 0x7f) << 0x1c | (ulong)(p[5] & 0x7f) << 0x23 |
            (ulong)(p[6] & 0x7f) << 0x2a | (ulong)(p[7] & 0x7f) << 0x31 | lVar2 << 0x38;
    sStack_8 = 9;
  }
  else {
    if (p + 9 < end) {
      bVar1 = p[9];
      if (-1 < (long)(char)bVar1) {
        if (0xf < bVar1) {
          return 0;
        }
        uVar3 = (ulong)(*p & 0x7f | (p[1] & 0x7f) << 7 | (p[2] & 0x7f) << 0xe |
                       (p[3] & 0x7f) << 0x15) | (ulong)(p[4] & 0x7f) << 0x1c |
                (ulong)(p[5] & 0x7f) << 0x23 |
                (ulong)(p[6] & 0x7f) << 0x2a |
                (ulong)(p[7] & 0x7f) << 0x31 |
                (ulong)(p[8] & 0x7f) << 0x38 | (long)(char)bVar1 << 0x3f;
        sStack_8 = 10;
        goto LAB_00119cfd;
      }
    }
    uVar3 = 0;
    sStack_8 = 0;
  }
LAB_00119cfd:
  *out_value = uVar3;
  return sStack_8;
}

Assistant:

size_t ReadU64Leb128(const uint8_t* p,
                     const uint8_t* end,
                     uint64_t* out_value) {
  if (p < end && (p[0] & 0x80) == 0) {
    *out_value = LEB128_1(uint64_t);
    return 1;
  } else if (p + 1 < end && (p[1] & 0x80) == 0) {
    *out_value = LEB128_2(uint64_t);
    return 2;
  } else if (p + 2 < end && (p[2] & 0x80) == 0) {
    *out_value = LEB128_3(uint64_t);
    return 3;
  } else if (p + 3 < end && (p[3] & 0x80) == 0) {
    *out_value = LEB128_4(uint64_t);
    return 4;
  } else if (p + 4 < end && (p[4] & 0x80) == 0) {
    *out_value = LEB128_5(uint64_t);
    return 5;
  } else if (p + 5 < end && (p[5] & 0x80) == 0) {
    *out_value = LEB128_6(uint64_t);
    return 6;
  } else if (p + 6 < end && (p[6] & 0x80) == 0) {
    *out_value = LEB128_7(uint64_t);
    return 7;
  } else if (p + 7 < end && (p[7] & 0x80) == 0) {
    *out_value = LEB128_8(uint64_t);
    return 8;
  } else if (p + 8 < end && (p[8] & 0x80) == 0) {
    *out_value = LEB128_9(uint64_t);
    return 9;
  } else if (p + 9 < end && (p[9] & 0x80) == 0) {
    // The top bits set represent values > 32 bits.
    if (p[9] & 0xf0) {
      return 0;
    }
    *out_value = LEB128_10(uint64_t);
    return 10;
  } else {
    // past the end.
    *out_value = 0;
    return 0;
  }
}